

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::CLUFactor<double>::solveUleftNoNZ
          (CLUFactor<double> *this,double eps,double *vec,double *rhs,int *rhsidx,int rhsn)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  pointer pdVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  pointer pdVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  double *pdVar19;
  int *piVar20;
  uint uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  
  piVar3 = (this->row).orig;
  piVar4 = (this->col).orig;
  piVar5 = (this->col).perm;
  if (0 < rhsn) {
    uVar14 = 0;
    do {
      iVar1 = piVar5[rhsidx[uVar14]];
      if (uVar14 == 0) {
        uVar15 = 0;
      }
      else {
        uVar22 = uVar14 & 0xffffffff;
        do {
          uVar11 = (uint)uVar22 - 1;
          uVar21 = uVar11 >> 1;
          uVar15 = (uint)uVar22;
          if (rhsidx[uVar21] <= iVar1) break;
          rhsidx[uVar22] = rhsidx[uVar21];
          uVar22 = (ulong)uVar21;
          uVar15 = uVar21;
        } while (1 < uVar11);
      }
      uVar14 = uVar14 + 1;
      rhsidx[(int)uVar15] = iVar1;
    } while (uVar14 != (uint)rhsn);
  }
  if (0 < rhsn) {
    pdVar6 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->u).row.idx;
    piVar8 = (this->u).row.len;
    piVar9 = (this->u).row.start;
    pdVar10 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar1 = *rhsidx;
      uVar15 = rhsn - 1;
      iVar16 = rhsidx[(long)rhsn + -1];
      if (rhsn < 4) {
        iVar18 = 1;
        iVar17 = 0;
      }
      else {
        iVar17 = 0;
        iVar18 = 1;
        do {
          iVar2 = rhsidx[iVar18];
          iVar12 = rhsidx[(long)iVar18 + 1];
          piVar20 = rhsidx + iVar17;
          if (iVar2 < iVar12) {
            iVar17 = iVar18;
            iVar12 = iVar2;
            if (iVar16 <= iVar2) goto LAB_001e3eb3;
          }
          else {
            if (iVar16 <= iVar12) goto LAB_001e3eb3;
            iVar17 = iVar18 + 1;
          }
          *piVar20 = iVar12;
          iVar18 = iVar17 * 2 + 1;
        } while (iVar18 < (int)(rhsn - 2U));
      }
      if ((iVar18 < (int)uVar15) && (rhsidx[iVar18] < iVar16)) {
        rhsidx[iVar17] = rhsidx[iVar18];
        iVar17 = iVar18;
      }
      piVar20 = rhsidx + iVar17;
LAB_001e3eb3:
      *piVar20 = iVar16;
      iVar16 = piVar4[iVar1];
      dVar23 = rhs[iVar16];
      rhs[iVar16] = 0.0;
      if (eps < ABS(dVar23)) {
        iVar1 = piVar3[iVar1];
        dVar23 = dVar23 * pdVar10[iVar1];
        vec[iVar1] = dVar23;
        iVar16 = piVar8[iVar1];
        if (iVar16 != 0) {
          iVar1 = piVar9[iVar1];
          pdVar19 = pdVar6 + iVar1;
          piVar20 = piVar7 + iVar1;
          do {
            iVar1 = *piVar20;
            dVar24 = rhs[iVar1];
            if ((dVar24 != 0.0) || (NAN(dVar24))) {
              dVar24 = dVar24 - *pdVar19 * dVar23;
              uVar14 = -(ulong)(dVar24 != 0.0);
              rhs[iVar1] = (double)(~uVar14 & 0x2b2bff2ee48e0530 | (ulong)dVar24 & uVar14);
            }
            else {
              dVar24 = *pdVar19 * -dVar23;
              if (eps < ABS(dVar24)) {
                rhs[iVar1] = dVar24;
                iVar1 = piVar5[iVar1];
                uVar11 = uVar15;
                if (0 < (int)uVar15) {
                  do {
                    uVar21 = uVar11 - 1;
                    uVar13 = uVar21 >> 1;
                    if (rhsidx[uVar13] <= iVar1) break;
                    rhsidx[uVar11] = rhsidx[uVar13];
                    uVar11 = uVar13;
                  } while (1 < uVar21);
                }
                uVar15 = uVar15 + 1;
                rhsidx[(int)uVar11] = iVar1;
              }
            }
            piVar20 = piVar20 + 1;
            pdVar19 = pdVar19 + 1;
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
      }
      rhsn = uVar15;
    } while (0 < (int)uVar15);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleftNoNZ(R eps, R* vec,
                                  R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }
}